

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O1

void __thiscall
tst_SerialiserCommon::insertBranch
          (tst_SerialiserCommon *this,QAbstractItemModel *model,QModelIndex *parent,bool multiRoles,
          int subBranches)

{
  default_random_engine *__urng;
  QAbstractItemModel *pQVar1;
  result_type_conflict rVar2;
  int iVar3;
  undefined4 in_register_00000084;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  QString baseString;
  uniform_int_distribution<int> colorDistribution;
  QString t;
  uniform_int_distribution<int> rowsDist;
  uniform_int_distribution<int> coulmnsDist;
  QModelIndex idx;
  QString local_198;
  default_random_engine *local_178;
  QModelIndex *local_170;
  uint local_168;
  int local_164;
  param_type local_160;
  undefined8 local_158;
  QArrayData *local_150;
  char16_t *local_148;
  undefined8 local_140;
  QString local_138;
  QArrayData *local_120;
  char16_t *local_118;
  undefined8 local_110;
  tst_SerialiserCommon *local_108;
  QArrayData *local_100 [3];
  QArrayData *local_e8 [3];
  QArrayData *local_d0;
  char16_t *local_c8;
  qsizetype qStack_c0;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined8 local_a0;
  QVariant local_90;
  QArrayData *local_70 [3];
  param_type local_58;
  param_type local_50;
  QModelIndex local_48;
  
  local_158 = CONCAT44(in_register_00000084,subBranches);
  local_160._M_a = 0;
  local_160._M_b = 5;
  local_50._M_a = 2;
  local_50._M_b = 5;
  local_58._M_a = 3;
  local_58._M_b = 6;
  __urng = &this->generator;
  local_108 = this;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_50,__urng,&local_50);
  (**(code **)(*(long *)model + 0x100))(model,0,rVar2,parent);
  local_178 = __urng;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_58,__urng,&local_58);
  (**(code **)(*(long *)model + 0xf8))(model,0,rVar2,parent);
  bVar6 = false;
  if ((-1 < parent->r) && (bVar6 = false, -1 < parent->c)) {
    bVar6 = parent->m != (QAbstractItemModel *)0x0;
  }
  if (bVar6) {
    pQVar1 = parent->m;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_b8.shared = (PrivateShared *)0x0;
      local_b8._8_8_ = 0;
      local_b8._16_8_ = 0;
      local_a0 = 2;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_b8,pQVar1,parent,2);
    }
    QVariant::toString();
    local_120 = (QArrayData *)0x0;
    local_118 = L"->";
    local_110 = 2;
    local_198.d.d = (Data *)local_d0;
    local_198.d.ptr = local_c8;
    local_198.d.size = qStack_c0;
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_198);
  }
  else {
    local_198.d.d = (Data *)0x0;
    local_198.d.ptr = (char16_t *)0x0;
    local_198.d.size = 0;
  }
  if (bVar6) {
    if (local_120 != (QArrayData *)0x0) {
      LOCK();
      (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_120,2,8);
      }
    }
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0,2,8);
      }
    }
    QVariant::~QVariant((QVariant *)&local_b8);
  }
  local_164 = (int)local_158 + -1;
  uVar4 = 0;
  local_170 = parent;
  local_168 = (uint)multiRoles;
  while( true ) {
    iVar3 = (**(code **)(*(long *)model + 0x78))(model,local_170);
    if ((long)iVar3 <= (long)uVar4) break;
    uVar5 = 0;
    while( true ) {
      iVar3 = (**(code **)(*(long *)model + 0x80))(model,local_170);
      if ((long)iVar3 <= (long)uVar5) break;
      (**(code **)(*(long *)model + 0x60))
                (&local_48,model,uVar4 & 0xffffffff,uVar5 & 0xffffffff,local_170);
      local_150 = (QArrayData *)0x0;
      local_148 = L"%1,%2[%3]";
      local_140 = 9;
      QString::arg((longlong)local_70,(int)&local_150,(int)uVar4,(QChar)0x0);
      QString::arg((longlong)local_100,(int)local_70,(int)uVar5,(QChar)0x0);
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_160,local_178,&local_160);
      QString::arg((longlong)local_e8,(int)local_100,rVar2,(QChar)0x0);
      local_138.d.d = local_198.d.d;
      local_138.d.ptr = local_198.d.ptr;
      local_138.d.size = local_198.d.size;
      if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append(&local_138);
      QVariant::QVariant(&local_90,&local_138);
      (**(code **)(*(long *)model + 0x98))(model,&local_48,&local_90,2);
      QVariant::~QVariant(&local_90);
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_e8[0] != (QArrayData *)0x0) {
        LOCK();
        (local_e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e8[0],2,8);
        }
      }
      if (local_100[0] != (QArrayData *)0x0) {
        LOCK();
        (local_100[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_100[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_100[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_100[0],2,8);
        }
      }
      if (local_70[0] != (QArrayData *)0x0) {
        LOCK();
        (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70[0],2,8);
        }
      }
      if (local_150 != (QArrayData *)0x0) {
        LOCK();
        (local_150->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_150->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_150->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_150,2,8);
        }
      }
      if (multiRoles) {
        rVar2 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_160,local_178,&local_160);
        QVariant::QVariant(&local_90,*(int *)(&DAT_0010d1a0 + (long)rVar2 * 4));
        (**(code **)(*(long *)model + 0x98))(model,&local_48,&local_90,8);
        QVariant::~QVariant(&local_90);
        rVar2 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_160,local_178,&local_160);
        QVariant::QVariant(&local_90,*(int *)(&DAT_0010d1a0 + (long)rVar2 * 4));
        (**(code **)(*(long *)model + 0x98))(model,&local_48,&local_90,9);
        QVariant::~QVariant(&local_90);
        QVariant::QVariant(&local_90,(int)uVar4);
        (**(code **)(*(long *)model + 0x98))(model,&local_48,&local_90,0x100);
        QVariant::~QVariant(&local_90);
        QVariant::QVariant(&local_90,(int)uVar5);
        (**(code **)(*(long *)model + 0x98))(model,&local_48,&local_90,0x101);
        QVariant::~QVariant(&local_90);
      }
      if (0 < (int)local_158) {
        insertBranch(local_108,model,&local_48,SUB41(local_168,0),local_164);
      }
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void tst_SerialiserCommon::insertBranch(QAbstractItemModel *model, const QModelIndex &parent, bool multiRoles, int subBranches)
{
    Q_ASSERT(model);
    Q_ASSERT(!parent.isValid() || parent.model() == model);
    const int randomBrushes[] = {Qt::red, Qt::blue, Qt::green, Qt::yellow, Qt::magenta, Qt::cyan};
    std::uniform_int_distribution<int> colorDistribution(0, (sizeof(randomBrushes) / sizeof(randomBrushes[0])) - 1);
    std::uniform_int_distribution<int> coulmnsDist(2, 5);
    std::uniform_int_distribution<int> rowsDist(3, 6);
    Q_ASSUME(model->insertColumns(0, coulmnsDist(generator), parent));
    Q_ASSUME(model->insertRows(0, rowsDist(generator), parent));
    const QString baseString = parent.isValid() ? (parent.data(Qt::EditRole).toString() + QStringLiteral("->")) : QString();
    for (int i = 0; i < model->rowCount(parent); ++i) {
        for (int j = 0; j < model->columnCount(parent); ++j) {
            const QModelIndex idx = model->index(i, j, parent);
            model->setData(idx, baseString + QStringLiteral("%1,%2[%3]").arg(i).arg(j).arg(colorDistribution(generator)), Qt::EditRole);
            if (multiRoles) {
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::BackgroundRole);
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::ForegroundRole);
                model->setData(idx, i, Qt::UserRole);
                model->setData(idx, j, Qt::UserRole + 1);
            }
            if (subBranches > 0)
                insertBranch(model, idx, multiRoles, subBranches - 1);
        }
    }
}